

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::BeginCombo(char *label,char *preview_value,ImGuiComboFlags flags)

{
  float fVar1;
  int iVar2;
  ImDrawList *this;
  ImVec2 pos;
  ImVec2 IVar3;
  ImVec2 p_min;
  ImVec2 p_max;
  undefined1 auVar4 [16];
  ImGuiContext *pIVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  bool bVar8;
  ImGuiID IVar9;
  ImU32 IVar10;
  ImGuiWindow *pIVar11;
  ImGuiContext *g;
  ImGuiWindow *pIVar12;
  uint uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  bool hovered;
  float local_f4;
  ImGuiID local_f0;
  bool held;
  ImRect frame_bb;
  char name [16];
  ImVec2 size_expected;
  ImRect r_outer;
  ImRect value_bb;
  ImVec2 local_50;
  ImVec2 size_contents;
  ImRect total_bb;
  
  pIVar6 = GImGui;
  iVar2 = (GImGui->NextWindowData).SizeConstraintCond;
  (GImGui->NextWindowData).SizeConstraintCond = 0;
  pIVar11 = pIVar6->CurrentWindow;
  pIVar11->WriteAccessed = true;
  if (pIVar11->SkipItems != false) {
    return false;
  }
  if ((~flags & 0x60U) == 0) {
    __assert_fail("(flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x2aee,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
  }
  IVar9 = ImGuiWindow::GetID(pIVar11,label,(char *)0x0);
  local_f4 = 0.0;
  if ((flags & 0x20U) == 0) {
    fVar14 = (GImGui->Style).FramePadding.y;
    local_f4 = fVar14 + fVar14 + GImGui->FontSize;
  }
  IVar3 = CalcTextSize(label,(char *)0x0,true,-1.0);
  fVar15 = IVar3.x;
  fVar14 = local_f4;
  if ((flags & 0x40U) == 0) {
    fVar14 = CalcItemWidth();
  }
  fVar1 = (pIVar6->Style).FramePadding.y;
  frame_bb.Min.x = (pIVar11->DC).CursorPos.x;
  frame_bb.Min.y = (pIVar11->DC).CursorPos.y;
  frame_bb.Max.x = fVar14 + frame_bb.Min.x;
  frame_bb.Max.y = fVar1 + fVar1 + IVar3.y + frame_bb.Min.y;
  fVar16 = 0.0;
  if (0.0 < fVar15) {
    fVar16 = (pIVar6->Style).ItemInnerSpacing.x + fVar15;
  }
  total_bb.Max.x = fVar16 + frame_bb.Max.x;
  total_bb.Max.y = frame_bb.Max.y + 0.0;
  local_f0 = IVar9;
  total_bb.Min.x = frame_bb.Min.x;
  total_bb.Min.y = frame_bb.Min.y;
  ItemSize(&total_bb,fVar1);
  IVar9 = local_f0;
  bVar7 = ItemAdd(&total_bb,local_f0,&frame_bb);
  if (!bVar7) {
    return false;
  }
  bVar7 = ButtonBehavior(&frame_bb,IVar9,&hovered,&held,0);
  bVar8 = IsPopupOpen(IVar9);
  value_bb.Min.y = frame_bb.Min.y;
  value_bb.Min.x = frame_bb.Min.x;
  value_bb.Max.y = frame_bb.Max.y;
  value_bb.Max.x = frame_bb.Max.x - local_f4;
  IVar10 = GetColorU32(hovered + 7,1.0);
  RenderNavHighlight(&frame_bb,IVar9,1);
  if ((flags & 0x40U) == 0) {
    name._4_4_ = frame_bb.Max.y;
    name._0_4_ = frame_bb.Max.x - local_f4;
    ImDrawList::AddRectFilled
              (pIVar11->DrawList,&frame_bb.Min,(ImVec2 *)name,IVar10,(pIVar6->Style).FrameRounding,5
              );
  }
  if ((flags & 0x20U) == 0) {
    this = pIVar11->DrawList;
    name._4_4_ = frame_bb.Min.y;
    name._0_4_ = frame_bb.Max.x - local_f4;
    IVar10 = GetColorU32(((byte)(hovered | bVar8) & 1) + 0x15,1.0);
    ImDrawList::AddRectFilled
              (this,(ImVec2 *)name,&frame_bb.Max,IVar10,(pIVar6->Style).FrameRounding,
               (uint)(fVar14 <= local_f4) * 5 + 10);
    fVar1 = (pIVar6->Style).FramePadding.y;
    IVar3.y = fVar1 + frame_bb.Min.y;
    IVar3.x = fVar1 + (frame_bb.Max.x - local_f4);
    RenderArrow(IVar3,3,1.0);
  }
  p_min.y = frame_bb.Min.y;
  p_min.x = frame_bb.Min.x;
  p_max.y = frame_bb.Max.y;
  p_max.x = frame_bb.Max.x;
  RenderFrameBorder(p_min,p_max,(pIVar6->Style).FrameRounding);
  if (preview_value != (char *)0x0 && (char)((flags & 0x40U) >> 6) == '\0') {
    IVar3 = (pIVar6->Style).FramePadding;
    name._0_4_ = IVar3.x + frame_bb.Min.x;
    name._4_4_ = IVar3.y + frame_bb.Min.y;
    auVar4._8_8_ = 0;
    auVar4._0_4_ = r_outer.Max.x;
    auVar4._4_4_ = r_outer.Max.y;
    r_outer = (ImRect)(auVar4 << 0x40);
    RenderTextClipped((ImVec2 *)name,&value_bb.Max,preview_value,(char *)0x0,(ImVec2 *)0x0,
                      &r_outer.Min,(ImRect *)0x0);
  }
  if (0.0 < fVar15) {
    pos.y = (pIVar6->Style).FramePadding.y + frame_bb.Min.y;
    pos.x = (pIVar6->Style).ItemInnerSpacing.x + frame_bb.Max.x;
    RenderText(pos,label,(char *)0x0,true);
  }
  if (bVar7) {
    if (bVar8) goto LAB_001726e5;
  }
  else if (pIVar6->NavActivateId != local_f0 || bVar8) {
    if (!bVar8) {
      return false;
    }
    goto LAB_001726e5;
  }
  if ((pIVar11->DC).NavLayerCurrent == 0) {
    pIVar11->NavLastIds[0] = local_f0;
  }
  OpenPopupEx(local_f0);
LAB_001726e5:
  if (iVar2 == 0) {
    uVar13 = flags | 4;
    if ((flags & 0x1eU) != 0) {
      uVar13 = flags;
    }
    flags = uVar13;
    uVar13 = (flags & 0x1eU) - 1;
    if ((flags & 0x1eU ^ uVar13) <= uVar13) {
      __assert_fail("ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x2b24,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
    }
    if ((flags & 4U) == 0) {
      if ((flags & 2U) == 0) {
        uVar13 = -(uint)((flags & 8U) == 0) | 0x14;
      }
      else {
        uVar13 = 4;
      }
    }
    else {
      uVar13 = 8;
    }
    fVar15 = CalcMaxPopupHeightFromItemCount(uVar13);
    pIVar5 = GImGui;
    (GImGui->NextWindowData).SizeConstraintCond = 1;
    (pIVar5->NextWindowData).SizeConstraintRect.Min.x = fVar14;
    *(undefined8 *)&(pIVar5->NextWindowData).SizeConstraintRect.Min.y = 0x7f7fffff00000000;
    (pIVar5->NextWindowData).SizeConstraintRect.Max.y = fVar15;
    (pIVar5->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
    (pIVar5->NextWindowData).SizeCallbackUserData = (void *)0x0;
  }
  else {
    (pIVar6->NextWindowData).SizeConstraintCond = iVar2;
    fVar15 = (pIVar6->NextWindowData).SizeConstraintRect.Min.x;
    uVar13 = -(uint)(fVar14 <= fVar15);
    (pIVar6->NextWindowData).SizeConstraintRect.Min.x =
         (float)(~uVar13 & (uint)fVar14 | (uint)fVar15 & uVar13);
  }
  ImFormatString(name,0x10,"##Combo_%02d",(ulong)(uint)(pIVar6->CurrentPopupStack).Size);
  pIVar11 = FindWindowByName(name);
  if ((pIVar11 != (ImGuiWindow *)0x0) && (pIVar11->WasActive == true)) {
    size_contents = CalcSizeContents(pIVar11);
    IVar3 = CalcSizeAutoFit(pIVar11,&size_contents);
    pIVar12 = pIVar11;
    size_expected = CalcSizeAfterConstraint(pIVar11,IVar3);
    if ((flags & 1U) != 0) {
      pIVar11->AutoPosLastDirection = 0;
    }
    r_outer = FindAllowedExtentRectForWindow(pIVar12);
    local_50.y = frame_bb.Max.y;
    local_50.x = frame_bb.Min.x;
    IVar3 = FindBestWindowPosForPopupEx
                      (&local_50,&size_expected,&pIVar11->AutoPosLastDirection,&r_outer,&frame_bb,
                       ImGuiPopupPositionPolicy_ComboBox);
    pIVar5 = GImGui;
    (GImGui->NextWindowData).PosVal = IVar3;
    (pIVar5->NextWindowData).PosPivotVal.x = 0.0;
    (pIVar5->NextWindowData).PosPivotVal.y = 0.0;
    (pIVar5->NextWindowData).PosCond = 1;
  }
  r_outer.Min.y = (pIVar6->Style).WindowPadding.y;
  r_outer.Min.x = (pIVar6->Style).FramePadding.x;
  PushStyleVar(1,&r_outer.Min);
  bVar7 = Begin(name,(bool *)0x0,0x4000143);
  PopStyleVar(1);
  if (!bVar7) {
    EndPopup();
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x2b44,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
  }
  return true;
}

Assistant:

bool ImGui::BeginCombo(const char* label, const char* preview_value, ImGuiComboFlags flags)
{
    // Always consume the SetNextWindowSizeConstraint() call in our early return paths
    ImGuiContext& g = *GImGui;
    ImGuiCond backup_next_window_size_constraint = g.NextWindowData.SizeConstraintCond;
    g.NextWindowData.SizeConstraintCond = 0;

    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    IM_ASSERT((flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)); // Can't use both flags together

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const float arrow_size = (flags & ImGuiComboFlags_NoArrowButton) ? 0.0f : GetFrameHeight();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const float w = (flags & ImGuiComboFlags_NoPreview) ? arrow_size : CalcItemWidth();
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y*2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(frame_bb, id, &hovered, &held);
    bool popup_open = IsPopupOpen(id);

    const ImRect value_bb(frame_bb.Min, frame_bb.Max - ImVec2(arrow_size, 0.0f));
    const ImU32 frame_col = GetColorU32(hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    RenderNavHighlight(frame_bb, id);
    if (!(flags & ImGuiComboFlags_NoPreview))
        window->DrawList->AddRectFilled(frame_bb.Min, ImVec2(frame_bb.Max.x - arrow_size, frame_bb.Max.y), frame_col, style.FrameRounding, ImDrawCornerFlags_Left);
    if (!(flags & ImGuiComboFlags_NoArrowButton))
    {
        window->DrawList->AddRectFilled(ImVec2(frame_bb.Max.x - arrow_size, frame_bb.Min.y), frame_bb.Max, GetColorU32((popup_open || hovered) ? ImGuiCol_ButtonHovered : ImGuiCol_Button), style.FrameRounding, (w <= arrow_size) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Right);
        RenderArrow(ImVec2(frame_bb.Max.x - arrow_size + style.FramePadding.y, frame_bb.Min.y + style.FramePadding.y), ImGuiDir_Down);
    }
    RenderFrameBorder(frame_bb.Min, frame_bb.Max, style.FrameRounding);
    if (preview_value != NULL && !(flags & ImGuiComboFlags_NoPreview))
        RenderTextClipped(frame_bb.Min + style.FramePadding, value_bb.Max, preview_value, NULL, NULL, ImVec2(0.0f,0.0f));
    if (label_size.x > 0)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    if ((pressed || g.NavActivateId == id) && !popup_open)
    {
        if (window->DC.NavLayerCurrent == 0)
            window->NavLastIds[0] = id;
        OpenPopupEx(id);
        popup_open = true;
    }

    if (!popup_open)
        return false;

    if (backup_next_window_size_constraint)
    {
        g.NextWindowData.SizeConstraintCond = backup_next_window_size_constraint;
        g.NextWindowData.SizeConstraintRect.Min.x = ImMax(g.NextWindowData.SizeConstraintRect.Min.x, w);
    }
    else
    {
        if ((flags & ImGuiComboFlags_HeightMask_) == 0)
            flags |= ImGuiComboFlags_HeightRegular;
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_));    // Only one
        int popup_max_height_in_items = -1;
        if (flags & ImGuiComboFlags_HeightRegular)     popup_max_height_in_items = 8;
        else if (flags & ImGuiComboFlags_HeightSmall)  popup_max_height_in_items = 4;
        else if (flags & ImGuiComboFlags_HeightLarge)  popup_max_height_in_items = 20;
        SetNextWindowSizeConstraints(ImVec2(w, 0.0f), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));
    }

    char name[16];
    ImFormatString(name, IM_ARRAYSIZE(name), "##Combo_%02d", g.CurrentPopupStack.Size); // Recycle windows based on depth

    // Peak into expected window size so we can position it
    if (ImGuiWindow* popup_window = FindWindowByName(name))
        if (popup_window->WasActive)
        {
            ImVec2 size_contents = CalcSizeContents(popup_window);
            ImVec2 size_expected = CalcSizeAfterConstraint(popup_window, CalcSizeAutoFit(popup_window, size_contents));
            if (flags & ImGuiComboFlags_PopupAlignLeft)
                popup_window->AutoPosLastDirection = ImGuiDir_Left;
            ImRect r_outer = FindAllowedExtentRectForWindow(popup_window);
            ImVec2 pos = FindBestWindowPosForPopupEx(frame_bb.GetBL(), size_expected, &popup_window->AutoPosLastDirection, r_outer, frame_bb, ImGuiPopupPositionPolicy_ComboBox);
            SetNextWindowPos(pos);
        }

    // Horizontally align ourselves with the framed text
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_Popup | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings;
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(style.FramePadding.x, style.WindowPadding.y));
    bool ret = Begin(name, NULL, window_flags);
    PopStyleVar();
    if (!ret)
    {
        EndPopup();
        IM_ASSERT(0);   // This should never happen as we tested for IsPopupOpen() above
        return false;
    }
    return true;
}